

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O1

vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_> *
__thiscall
spvtools::opt::SENode::CollectValueUnknownNodes
          (vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
           *__return_storage_ptr__,SENode *this)

{
  pointer *pppSVar1;
  iterator __position;
  pointer ppSVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer ppSVar4;
  SEValueUnknown *value_unknown_node;
  vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_> local_38
  ;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*this->_vptr_SENode[0xe])(this);
  local_38.
  super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar3);
  if ((SEValueUnknown *)
      local_38.
      super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (SEValueUnknown *)0x0) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>::
      _M_realloc_insert<spvtools::opt::SEValueUnknown*const&>
                ((vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>
                  *)__return_storage_ptr__,__position,(SEValueUnknown **)&local_38);
    }
    else {
      *__position._M_current =
           (SEValueUnknown *)
           local_38.
           super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pppSVar1 = &(__return_storage_ptr__->
                  super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
  }
  ppSVar2 = (this->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar4 = (this->children_).
                 super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar4 != ppSVar2;
      ppSVar4 = ppSVar4 + 1) {
    CollectValueUnknownNodes(&local_38,*ppSVar4);
    std::vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::SEValueUnknown**,std::vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>>>
              ((vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>
                *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               local_38.
               super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_38.
               super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if ((SEValueUnknown *)
        local_38.
        super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (SEValueUnknown *)0x0) {
      operator_delete(local_38.
                      super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SEValueUnknown*> CollectValueUnknownNodes() {
    std::vector<SEValueUnknown*> value_unknown_nodes{};

    if (auto value_unknown_node = AsSEValueUnknown()) {
      value_unknown_nodes.push_back(value_unknown_node);
    }

    for (auto child : GetChildren()) {
      auto child_value_unknown_nodes = child->CollectValueUnknownNodes();
      value_unknown_nodes.insert(value_unknown_nodes.end(),
                                 child_value_unknown_nodes.begin(),
                                 child_value_unknown_nodes.end());
    }

    return value_unknown_nodes;
  }